

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O3

void floaxie::digit_gen_select<false>::gen<float,char>
               (diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mp,
               diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mm,char *buffer,int *len,int *K)

{
  uchar uVar1;
  uint uVar2;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> dVar3;
  kappa_pair_type kVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  if (0 < Mp->m_e) {
    __assert_fail("Mp.exponent() <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x7e,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  dVar3 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator-(Mp,Mm);
  if (0x1f < (uint)-Mp->m_e) {
    __assert_fail("power < bit_size<NumericType>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/bit_ops.h"
                  ,0x3e,"NumericType floaxie::raised_bit(std::size_t) [NumericType = unsigned int]")
    ;
  }
  uVar2 = Mp->m_f;
  bVar5 = (byte)-Mp->m_e;
  uVar10 = uVar2 >> (bVar5 & 0x1f);
  uVar12 = ~(-1 << (bVar5 & 0x1f));
  uVar7 = uVar2 & uVar12;
  if (uVar10 == 0 && uVar7 == 0) {
    __assert_fail("p1 || p2",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x87,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  *len = 0;
  if (uVar2 >> (bVar5 & 0x1f) == 0) {
    uVar2 = 0;
    if (dVar3.m_f < uVar7) goto LAB_0029d7e8;
  }
  else {
    kVar4 = calculate_kappa_div(uVar10);
    if (kVar4.first == '\0') {
      bVar6 = 0;
    }
    else {
      uVar9 = (ulong)kVar4 >> 0x20;
      do {
        uVar1 = kVar4.first;
        iVar11 = *len;
        *len = iVar11 + 1;
        buffer[iVar11] = (char)(uVar10 / uVar9) + '0';
        kVar4._0_4_ = kVar4._0_4_ - 1;
        kVar4.second = 0;
        bVar6 = (byte)kVar4._0_4_;
        if (uVar1 == '\x01') break;
        uVar10 = (uint)((ulong)uVar10 % uVar9);
        uVar9 = uVar9 / 10;
      } while (uVar10 != 0);
    }
    uVar2 = (uint)bVar6;
    if (uVar7 <= dVar3.m_f) {
      iVar11 = uVar2 + *K;
      goto LAB_0029d841;
    }
    memset(buffer + *len,0x30,(ulong)bVar6);
    iVar11 = *len;
    *len = *len + uVar2;
    uVar2 = (uint)(*len != 0 && SCARRY4(iVar11,uVar2) == *len < 0);
LAB_0029d7e8:
    bVar6 = 0;
    do {
      cVar8 = (char)(uVar7 * 10 >> (bVar5 & 0x1f));
      if ((byte)(cVar8 != '\0' | (byte)uVar2) == 1) {
        iVar11 = *len;
        *len = iVar11 + 1;
        buffer[iVar11] = cVar8 + '0';
      }
      uVar7 = uVar7 * 10 & uVar12;
      bVar6 = bVar6 + 1;
      uVar10 = dVar3.m_f * 10;
      dVar3.m_e = 0;
      dVar3.m_f = uVar10;
    } while (uVar10 < uVar7);
    uVar2 = (uint)bVar6;
  }
  iVar11 = *K - uVar2;
LAB_0029d841:
  *K = iVar11;
  return;
}

Assistant:

inline static void gen(const diy_fp<FloatType>& Mp, const diy_fp<FloatType>& Mm, CharType* buffer, int* len, int* K) noexcept
		{
			assert(Mp.exponent() <= 0);

			const diy_fp<FloatType>& delta(Mp - Mm);

			const diy_fp<FloatType> one(raised_bit<typename diy_fp<FloatType>::mantissa_storage_type>(-Mp.exponent()), Mp.exponent());

			half_of_mantissa_storage_type p1 = Mp.mantissa() >> -one.exponent();
			typename diy_fp<FloatType>::mantissa_storage_type p2 = Mp.mantissa() & (one.mantissa() - 1);

			assert(p1 || p2);

			*len = 0;

			auto delta_f = delta.mantissa();

			const bool close_to_delta = p2 <= delta_f;

			if (p1)
			{
				auto&& kappa_div(calculate_kappa_div(p1));

				unsigned char& kappa(kappa_div.first);
				half_of_mantissa_storage_type& div(kappa_div.second);

				while (kappa > 0 && p1)
				{
					buffer[(*len)++] = '0' + p1 / div;

					p1 %= div;

					kappa--;
					div /= 10;
				}

				if (close_to_delta)
				{
					*K += kappa;
					return;
				}
				else
				{
					wrap::memset(buffer + (*len), CharType('0'), kappa);
					(*len) += kappa;
				}
			}

			const bool some_already_written = (*len) > 0;
			unsigned char kappa(0);

			while (p2 > delta_f)
			{
				p2 *= 10;

				const unsigned char d = p2 >> -one.exponent();

				if (some_already_written || d)
					buffer[(*len)++] = '0' + d;

				p2 &= one.mantissa() - 1;

				++kappa;
				delta_f *= 10;
			}

			*K -= kappa;
		}